

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

QDateTimeEdit * __thiscall QDateTimeEdit::dateTimeFromText(QDateTimeEdit *this,QString *text)

{
  QString *input;
  long *in_RDX;
  long in_FS_OFFSET;
  State state;
  int pos;
  undefined4 local_40;
  State local_3c;
  QArrayData *local_38;
  long lStack_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  input = (QString *)(text->d).ptr;
  local_38 = (QArrayData *)*in_RDX;
  lStack_30 = in_RDX[1];
  local_28 = in_RDX[2];
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_3c = QLineEdit::cursorPosition((QLineEdit *)input[0x25].d.d);
  local_40 = 2;
  QDateTimeEditPrivate::validateAndInterpret
            ((QDateTimeEditPrivate *)this,input,(int *)&local_38,&local_3c,SUB81(&local_40,0));
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEdit::dateTimeFromText(const QString &text) const
{
    Q_D(const QDateTimeEdit);
    QString copy = text;
    int pos = d->edit->cursorPosition();
    QValidator::State state = QValidator::Acceptable;
    return d->validateAndInterpret(copy, pos, state);
}